

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O1

ColumnDataCollection * __thiscall
duckdb::BatchedDataCollection::Batch(BatchedDataCollection *this,idx_t batch_index)

{
  _Base_ptr p_Var1;
  type pCVar2;
  InternalException *this_00;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  string local_40;
  
  p_Var4 = &(this->data)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var4->_M_header;
  for (; p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) < batch_index]
      ) {
    if (*(ulong *)(p_Var1 + 1) >= batch_index) {
      p_Var3 = p_Var1;
    }
  }
  p_Var1 = &p_Var4->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var4) &&
     (p_Var1 = p_Var3, batch_index < *(ulong *)(p_Var3 + 1))) {
    p_Var1 = &p_Var4->_M_header;
  }
  if ((_Rb_tree_header *)p_Var1 != p_Var4) {
    pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator*((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                          *)&p_Var1[1]._M_parent);
    return pCVar2;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "This batched data collection does not contain a collection for batch_index %d","");
  InternalException::InternalException<unsigned_long>(this_00,&local_40,batch_index);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const ColumnDataCollection &BatchedDataCollection::Batch(idx_t batch_index) const {
	auto entry = data.find(batch_index);
	if (entry == data.end()) {
		throw InternalException("This batched data collection does not contain a collection for batch_index %d",
		                        batch_index);
	}
	return *entry->second;
}